

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

SnapHandler * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::NextOpenEntry
          (UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL> *this)

{
  SnapHandler *pSVar1;
  SnapHandler *entry;
  UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL> *this_local;
  
  if ((this->m_inlineHeadBlock).EndPos < (this->m_inlineHeadBlock).CurrPos) {
    TTDAbort_unrecoverable_error("We are off the end of the array");
  }
  if (0x800 < (ulong)((long)(this->m_inlineHeadBlock).CurrPos -
                     (long)(this->m_inlineHeadBlock).BlockData) / 0x28) {
    TTDAbort_unrecoverable_error("We are off the end of the array");
  }
  if ((this->m_inlineHeadBlock).CurrPos == (this->m_inlineHeadBlock).EndPos) {
    AddArrayLink(this);
  }
  pSVar1 = (this->m_inlineHeadBlock).CurrPos;
  (this->m_inlineHeadBlock).CurrPos = (this->m_inlineHeadBlock).CurrPos + 1;
  return pSVar1;
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }